

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitRefAs
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,RefAs *curr)

{
  int iVar1;
  bool bVar2;
  Literal *pLVar3;
  Literal *value;
  undefined1 local_b8 [8];
  Flow flow;
  Literal local_58;
  Literal local_40;
  
  visit((Flow *)local_b8,this,*(Expression **)(curr + 0x18));
  if (flow.breakTo.super_IString.str._M_len == 0) {
    pLVar3 = Flow::getSingleValue((Flow *)local_b8);
    iVar1 = *(int *)(curr + 0x10);
    if (iVar1 == 2) {
      value = &local_40;
      ::wasm::Literal::externalize();
      Flow::Flow(__return_storage_ptr__,value);
    }
    else if (iVar1 == 1) {
      value = &local_58;
      ::wasm::Literal::internalize();
      Flow::Flow(__return_storage_ptr__,value);
    }
    else {
      if (iVar1 != 0) {
        ::wasm::handle_unreachable
                  ("unimplemented ref.as_*",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                   ,0x72c);
      }
      bVar2 = Type::isNull(&pLVar3->type);
      if (bVar2) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      value = (Literal *)&flow.breakTo.super_IString.str._M_str;
      ::wasm::Literal::Literal(value,pLVar3);
      Flow::Flow(__return_storage_ptr__,value);
    }
    ::wasm::Literal::~Literal(value);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_b8);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefAs(RefAs* curr) {
    NOTE_ENTER("RefAs");
    Flow flow = visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    const auto& value = flow.getSingleValue();
    NOTE_EVAL1(value);
    switch (curr->op) {
      case RefAsNonNull:
        if (value.isNull()) {
          trap("null ref");
        }
        return value;
      case ExternInternalize:
        return value.internalize();
      case ExternExternalize:
        return value.externalize();
    }
    WASM_UNREACHABLE("unimplemented ref.as_*");
  }